

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetEffectSourcePrivate::draw(QWidgetEffectSourcePrivate *this,QPainter *painter)

{
  QWidgetPaintContext *pQVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  QWidgetPrivate *this_01;
  QWExtra *pQVar3;
  long in_FS_OFFSET;
  QRegion toBePainted;
  QRect local_40;
  QRegion local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->context;
  if ((pQVar1 == (QWidgetPaintContext *)0x0) || (pQVar1->painter != painter)) {
    this_00 = this->m_widget;
    local_40.x1.m_i = 0;
    local_40.y1.m_i = 0;
    QRegion::QRegion(&local_30);
    QWidget::render(this_00,painter,(QPoint *)&local_40,&local_30,(RenderFlags)0x3);
  }
  else {
    local_30.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_30,&pQVar1->rgn);
    pQVar2 = this->m_widget->data;
    local_40.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    local_40.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    local_40.x1.m_i = 0;
    local_40.y1.m_i = 0;
    QRegion::operator&=(&local_30,&local_40);
    this_01 = *(QWidgetPrivate **)&this->m_widget->field_0x8;
    pQVar3 = (this_01->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar3 != (QWExtra *)0x0) && ((pQVar3->field_0x7c & 0x80) != 0)) {
      QRegion::operator&=(&local_30,&pQVar3->mask);
    }
    pQVar1 = this->context;
    QWidgetPrivate::drawWidget
              (this_01,pQVar1->pdev,&local_30,&pQVar1->offset,
               (DrawWidgetFlags)
               (pQVar1->flags).super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i,pQVar1->sharedPainter,
               pQVar1->repaintManager);
  }
  QRegion::~QRegion(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetEffectSourcePrivate::draw(QPainter *painter)
{
    if (!context || context->painter != painter) {
        m_widget->render(painter);
        return;
    }

    // The region saved in the context is neither clipped to the rect
    // nor the mask, so we have to clip it here before calling drawWidget.
    QRegion toBePainted = context->rgn;
    toBePainted &= m_widget->rect();
    QWidgetPrivate *wd = qt_widget_private(m_widget);
    if (wd->extra && wd->extra->hasMask)
        toBePainted &= wd->extra->mask;

    wd->drawWidget(context->pdev, toBePainted, context->offset, context->flags,
                   context->sharedPainter, context->repaintManager);
}